

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Complex.cpp
# Opt level: O0

void __thiscall Complex::buyOption(Complex *this,EuropeanPut *option)

{
  double *pdVar1;
  double local_58 [3];
  EuropeanPut local_40;
  Option *local_18;
  EuropeanPut *option_local;
  Complex *this_local;
  
  local_18 = (Option *)option;
  option_local = (EuropeanPut *)this;
  EuropeanPut::EuropeanPut(&local_40,option);
  std::vector<EuropeanPut,_std::allocator<EuropeanPut>_>::push_back(&this->european_put,&local_40);
  EuropeanPut::~EuropeanPut(&local_40);
  local_58[0] = Option::getMaturity(local_18);
  pdVar1 = std::max<double>(&this->max_T,local_58);
  this->max_T = *pdVar1;
  return;
}

Assistant:

void Complex::buyOption(EuropeanPut const& option)
{
	european_put.push_back(EuropeanPut(option));
	max_T = std::max(max_T, option.getMaturity());
}